

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
parse_format_string<false,wchar_t,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&>
          (internal *this,basic_string_view<wchar_t> format_str,
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *handler)

{
  ulong uVar1;
  internal *end;
  wchar_t wVar2;
  buffer<wchar_t> *pbVar3;
  size_t sVar4;
  internal *piVar5;
  internal *piVar6;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *this_00;
  buffer<wchar_t> *c;
  error_handler *this_01;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *this_02;
  pfs_writer write;
  pfs_writer local_40;
  id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
  local_38;
  
  this_00 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
             *)format_str.size_;
  if (format_str.data_ != (wchar_t *)0x0) {
    end = this + (long)format_str.data_ * 4;
    local_40.handler_ = this_00;
    do {
      this_01 = (error_handler *)&local_40;
      wVar2 = *(wchar_t *)this;
      piVar5 = this;
      while (wVar2 != L'{') {
        piVar5 = piVar5 + 4;
        if (piVar5 == end) {
          parse_format_string<false,_wchar_t,_fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&>
          ::pfs_writer::operator()(&local_40,(wchar_t *)this,(wchar_t *)end);
          return;
        }
        wVar2 = *(wchar_t *)piVar5;
      }
      parse_format_string<false,_wchar_t,_fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&>
      ::pfs_writer::operator()((pfs_writer *)this_01,(wchar_t *)this,(wchar_t *)piVar5);
      piVar5 = piVar5 + 4;
      if (piVar5 == end) {
        error_handler::on_error(this_01,"invalid format string");
      }
      if ((char)*(int *)piVar5 == '}') {
        format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
        ::on_arg_id(this_00);
        piVar6 = piVar5;
LAB_001796b4:
        piVar5 = piVar6;
        format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
        ::on_replacement_field(this_00,(wchar_t *)piVar5);
      }
      else if (*(int *)piVar5 == 0x7b) {
        pbVar3 = (this_00->context).out_.container;
        sVar4 = pbVar3->size_;
        uVar1 = sVar4 + 1;
        if (pbVar3->capacity_ < uVar1) {
          (**pbVar3->_vptr_buffer)(pbVar3,uVar1);
        }
        pbVar3->size_ = uVar1;
        pbVar3->ptr_[sVar4] = *(wchar_t *)piVar5;
        (this_00->context).out_.container = pbVar3;
      }
      else {
        local_38.handler = this_00;
        piVar6 = (internal *)
                 parse_arg_id<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                           ((wchar_t *)piVar5,(wchar_t *)end,&local_38);
        if (piVar6 == end) {
LAB_00179789:
          error_handler::on_error((error_handler *)piVar5,"missing \'}\' in format string");
        }
        if (*(wchar_t *)piVar6 != L':') {
          if (*(wchar_t *)piVar6 != L'}') goto LAB_00179789;
          goto LAB_001796b4;
        }
        this_02 = this_00;
        piVar5 = (internal *)
                 format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                 ::on_format_specs(this_00,(wchar_t *)(piVar6 + 4),(wchar_t *)end);
        if ((piVar5 == end) || (*(wchar_t *)piVar5 != L'}')) {
          error_handler::on_error((error_handler *)this_02,"unknown format specifier");
        }
      }
      this = piVar5 + 4;
    } while (this != end);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct pfs_writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}